

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O2

char * cinatra::detail::parse_response
                 (char *buf,char *buf_end,int *minor_version,int *status,char **msg,size_t *msg_len,
                 http_header *headers,size_t *num_headers,size_t max_headers,int *ret)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  bool has_upgrade;
  bool has_close;
  bool has_connection;
  
  pcVar2 = parse_http_version(buf,buf_end,minor_version,ret);
  if (pcVar2 != (char *)0x0) {
    if (*pcVar2 == ' ') {
      if ((long)buf_end - (long)(pcVar2 + 1) < 4) {
        *ret = -2;
        return (char *)0x0;
      }
      cVar1 = pcVar2[1];
      if (0xf5 < (byte)(cVar1 - 0x3aU)) {
        iVar3 = (uint)(byte)(cVar1 - 0x30) * 100;
        *status = iVar3;
        if (0xf5 < (byte)(pcVar2[2] - 0x3aU)) {
          iVar3 = iVar3 + (uint)(byte)(pcVar2[2] * '\n' + 0x20);
          *status = iVar3;
          if ((0xf5 < (byte)(pcVar2[3] - 0x3aU)) &&
             (*status = iVar3 + (uint)(byte)(pcVar2[3] - 0x30), pcVar2[4] == ' ')) {
            pcVar2 = get_token_to_eol(pcVar2 + 5,buf_end,msg,msg_len,ret);
            if (pcVar2 == (char *)0x0) {
              return (char *)0x0;
            }
            pcVar2 = parse_headers(pcVar2,buf_end,headers,num_headers,max_headers,ret,
                                   &has_connection,&has_close,&has_upgrade);
            return pcVar2;
          }
        }
      }
    }
    *ret = -1;
  }
  return (char *)0x0;
}

Assistant:

inline const char *parse_response(const char *buf, const char *buf_end,
                                  int *minor_version, int *status,
                                  const char **msg, size_t *msg_len,
                                  http_header *headers, size_t *num_headers,
                                  size_t max_headers, int *ret) {
  /* parse "HTTP/1.x" */
  if ((buf = parse_http_version(buf, buf_end, minor_version, ret)) == NULL) {
    return NULL;
  }
  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* parse status code, we want at least [:digit:][:digit:][:digit:]<other char>
   * to try to parse */
  if (buf_end - buf < 4) {
    *ret = -2;
    return NULL;
  }
  PARSE_INT_3(status);

  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* get message */
  if ((buf = get_token_to_eol(buf, buf_end, msg, msg_len, ret)) == NULL) {
    return NULL;
  }

  bool has_connection, has_close, has_upgrade;

  return parse_headers(buf, buf_end, headers, num_headers, max_headers, ret,
                       has_connection, has_close, has_upgrade);
}